

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O0

void capnp::_::anon_unknown_0::checkStruct(StructReader reader)

{
  uchar uVar1;
  bool bVar2;
  unsigned_short uVar3;
  uint uVar4;
  ListElementCount LVar5;
  int iVar6;
  int iVar7;
  ListElementCount LVar8;
  unsigned_long uVar9;
  unsigned_short local_366;
  uint local_364;
  bool local_35d;
  ElementCount local_35c;
  ListElementCount LStack_358;
  bool _kj_shouldLog_18;
  uint j;
  Fault local_350;
  Fault f_3;
  undefined1 local_328 [8];
  ListReader element_1;
  ListElementCount local_2f0;
  uint i_1;
  Fault local_2e8;
  Fault f_2;
  undefined1 local_2c0 [8];
  ListReader list_2;
  StructReader local_270;
  int local_23c;
  int local_238;
  bool local_231;
  undefined1 local_230 [7];
  bool _kj_shouldLog_17;
  StructReader local_210;
  int local_1dc;
  int local_1d8;
  bool local_1d1;
  undefined1 local_1d0 [7];
  bool _kj_shouldLog_16;
  StructReader element;
  ListElementCount local_198;
  int i;
  Fault local_190;
  Fault f_1;
  undefined1 local_168 [8];
  ListReader list_1;
  bool local_12d;
  int local_12c;
  int iStack_128;
  bool _kj_shouldLog_15;
  bool local_121;
  int local_120;
  int iStack_11c;
  bool _kj_shouldLog_14;
  bool local_115;
  bool _kj_shouldLog_13;
  ListElementCount local_108;
  uint local_104;
  Fault local_100;
  Fault f;
  undefined1 local_d8 [8];
  ListReader list;
  uint local_a0;
  bool local_99;
  undefined1 local_98 [7];
  bool _kj_shouldLog_12;
  undefined1 local_78 [8];
  StructReader subStruct;
  bool local_40;
  bool local_3f;
  bool local_3e;
  bool _kj_shouldLog_11;
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  bool _kj_shouldLog_8;
  bool _kj_shouldLog_7;
  bool _kj_shouldLog_6;
  bool _kj_shouldLog_5;
  bool _kj_shouldLog_4;
  uint local_34;
  bool _kj_shouldLog_3;
  bool local_2d;
  uint local_2c;
  uint uStack_28;
  bool _kj_shouldLog_2;
  bool local_21;
  unsigned_long uStack_20;
  bool _kj_shouldLog_1;
  unsigned_long_long local_18;
  bool local_9;
  bool _kj_shouldLog;
  
  uVar9 = StructReader::getDataField<unsigned_long>((StructReader *)&stack0x00000008,0);
  if (uVar9 != 0x1011121314151617) {
    local_9 = kj::_::Debug::shouldLog(ERROR);
    while (local_9 != false) {
      local_18 = 0x1011121314151617;
      uStack_20 = StructReader::getDataField<unsigned_long>((StructReader *)&stack0x00000008,0);
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0x1011121314151617ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,&local_18,&stack0xffffffffffffffe0);
      local_9 = false;
    }
  }
  uVar4 = StructReader::getDataField<unsigned_int>((StructReader *)&stack0x00000008,2);
  if (uVar4 != 0x20212223) {
    local_21 = kj::_::Debug::shouldLog(ERROR);
    while (local_21 != false) {
      uStack_28 = 0x20212223;
      local_2c = StructReader::getDataField<unsigned_int>((StructReader *)&stack0x00000008,2);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xeb,ERROR,
                 "\"failed: expected \" \"(0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x20212223u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 &stack0xffffffffffffffd8,&local_2c);
      local_21 = false;
    }
  }
  uVar3 = StructReader::getDataField<unsigned_short>((StructReader *)&stack0x00000008,6);
  if (uVar3 != 0x3031) {
    local_2d = kj::_::Debug::shouldLog(ERROR);
    while (local_2d != false) {
      local_34 = 0x3031;
      __kj_shouldLog_4 =
           StructReader::getDataField<unsigned_short>((StructReader *)&stack0x00000008,6);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xec,ERROR,
                 "\"failed: expected \" \"(0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))\", 0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x3031u) == (reader.getDataField<uint16_t>(6 * ELEMENTS))",
                 &local_34,(unsigned_short *)&_kj_shouldLog_4);
      local_2d = false;
    }
  }
  uVar1 = StructReader::getDataField<unsigned_char>((StructReader *)&stack0x00000008,0xe);
  if (uVar1 != '@') {
    _kj_shouldLog_5 = kj::_::Debug::shouldLog(ERROR);
    while (_kj_shouldLog_5 != false) {
      __kj_shouldLog_10 = 0x40;
      _kj_shouldLog_11 =
           (bool)StructReader::getDataField<unsigned_char>((StructReader *)&stack0x00000008,0xe);
      kj::_::Debug::log<char_const(&)[74],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xed,ERROR,
                 "\"failed: expected \" \"(0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))\", 0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS)"
                 ,(char (*) [74])
                  "failed: expected (0x40u) == (reader.getDataField<uint8_t>(14 * ELEMENTS))",
                 (uint *)&_kj_shouldLog_10,&_kj_shouldLog_11);
      _kj_shouldLog_5 = false;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x78);
  if (bVar2) {
    local_3e = kj::_::Debug::shouldLog(ERROR);
    while (local_3e != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xee,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(120 * ELEMENTS))\"",
                 (char (*) [62])"failed: expected !(reader.getDataField<bool>(120 * ELEMENTS))");
      local_3e = false;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x79);
  if (bVar2) {
    local_3f = kj::_::Debug::shouldLog(ERROR);
    while (local_3f != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xef,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(121 * ELEMENTS))\"",
                 (char (*) [62])"failed: expected !(reader.getDataField<bool>(121 * ELEMENTS))");
      local_3f = false;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7a);
  if (!bVar2) {
    local_40 = kj::_::Debug::shouldLog(ERROR);
    while (local_40 != false) {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf0,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(122 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(122 * ELEMENTS)");
      local_40 = false;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7b);
  if (bVar2) {
    subStruct._47_1_ = kj::_::Debug::shouldLog(ERROR);
    while (subStruct._47_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf1,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(123 * ELEMENTS))\"",
                 (char (*) [62])"failed: expected !(reader.getDataField<bool>(123 * ELEMENTS))");
      subStruct._47_1_ = 0;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7c);
  if (!bVar2) {
    subStruct._46_1_ = kj::_::Debug::shouldLog(ERROR);
    while (subStruct._46_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf2,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(124 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(124 * ELEMENTS)");
      subStruct._46_1_ = 0;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7d);
  if (!bVar2) {
    subStruct._45_1_ = kj::_::Debug::shouldLog(ERROR);
    while (subStruct._45_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf3,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(125 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(125 * ELEMENTS)");
      subStruct._45_1_ = 0;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7e);
  if (!bVar2) {
    subStruct._44_1_ = kj::_::Debug::shouldLog(ERROR);
    while (subStruct._44_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[59]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf4,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(126 * ELEMENTS)\"",
                 (char (*) [59])"failed: expected reader.getDataField<bool>(126 * ELEMENTS)");
      subStruct._44_1_ = 0;
    }
  }
  bVar2 = StructReader::getDataField<bool>((StructReader *)&stack0x00000008,0x7f);
  if (bVar2) {
    subStruct.nestingLimit._3_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)subStruct.nestingLimit._3_1_ != false) {
      kj::_::Debug::log<char_const(&)[62]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(127 * ELEMENTS))\"",
                 (char (*) [62])"failed: expected !(reader.getDataField<bool>(127 * ELEMENTS))");
      subStruct.nestingLimit._3_1_ = false;
    }
  }
  StructReader::getPointerField((PointerReader *)local_98,(StructReader *)&stack0x00000008,0);
  PointerReader::getStruct
            ((StructReader *)local_78,(PointerReader *)local_98,
             (word *)(anonymous_namespace)::SUBSTRUCT_DEFAULT);
  uVar4 = StructReader::getDataField<unsigned_int>((StructReader *)local_78,0);
  if (uVar4 != 0x7b) {
    local_99 = kj::_::Debug::shouldLog(ERROR);
    while (local_99 != false) {
      local_a0 = 0x7b;
      list._44_4_ = StructReader::getDataField<unsigned_int>((StructReader *)local_78,0);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0xfa,ERROR,
                 "\"failed: expected \" \"(123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))\", 123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (123u) == (subStruct.getDataField<uint32_t>(0 * ELEMENTS))",
                 &local_a0,(uint *)&list.field_0x2c);
      local_99 = false;
    }
  }
  StructReader::getPointerField((PointerReader *)&f,(StructReader *)&stack0x00000008,1);
  PointerReader::getList((ListReader *)local_d8,(PointerReader *)&f,FOUR_BYTES,(word *)0x0);
  LVar5 = ListReader::size((ListReader *)local_d8);
  if (LVar5 != 3) {
    local_104 = 3;
    local_108 = ListReader::size((ListReader *)local_d8);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0xff,FAILED,"(3 * ELEMENTS) == (list.size())","3 * ELEMENTS, list.size()",&local_104
               ,&local_108);
    kj::_::Debug::Fault::fatal(&local_100);
  }
  iVar6 = ListReader::getDataElement<int>((ListReader *)local_d8,0);
  if (iVar6 != 200) {
    local_115 = kj::_::Debug::shouldLog(ERROR);
    while (local_115 != false) {
      iStack_11c = 200;
      local_120 = ListReader::getDataElement<int>((ListReader *)local_d8,0);
      kj::_::Debug::log<char_const(&)[71],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x100,ERROR,
                 "\"failed: expected \" \"(200) == (list.getDataElement<int32_t>(0 * ELEMENTS))\", 200, list.getDataElement<int32_t>(0 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (200) == (list.getDataElement<int32_t>(0 * ELEMENTS))",
                 &stack0xfffffffffffffee4,&local_120);
      local_115 = false;
    }
  }
  iVar6 = ListReader::getDataElement<int>((ListReader *)local_d8,1);
  if (iVar6 != 0xc9) {
    local_121 = kj::_::Debug::shouldLog(ERROR);
    while (local_121 != false) {
      iStack_128 = 0xc9;
      local_12c = ListReader::getDataElement<int>((ListReader *)local_d8,1);
      kj::_::Debug::log<char_const(&)[71],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x101,ERROR,
                 "\"failed: expected \" \"(201) == (list.getDataElement<int32_t>(1 * ELEMENTS))\", 201, list.getDataElement<int32_t>(1 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (201) == (list.getDataElement<int32_t>(1 * ELEMENTS))",
                 &stack0xfffffffffffffed8,&local_12c);
      local_121 = false;
    }
  }
  iVar6 = ListReader::getDataElement<int>((ListReader *)local_d8,2);
  if (iVar6 != 0xca) {
    local_12d = kj::_::Debug::shouldLog(ERROR);
    while (local_12d != false) {
      list_1._44_4_ = 0xca;
      list_1.nestingLimit = ListReader::getDataElement<int>((ListReader *)local_d8,2);
      kj::_::Debug::log<char_const(&)[71],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x102,ERROR,
                 "\"failed: expected \" \"(202) == (list.getDataElement<int32_t>(2 * ELEMENTS))\", 202, list.getDataElement<int32_t>(2 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (202) == (list.getDataElement<int32_t>(2 * ELEMENTS))",
                 (int *)&list_1.field_0x2c,&list_1.nestingLimit);
      local_12d = false;
    }
  }
  StructReader::getPointerField((PointerReader *)&f_1,(StructReader *)&stack0x00000008,2);
  PointerReader::getList((ListReader *)local_168,(PointerReader *)&f_1,INLINE_COMPOSITE,(word *)0x0)
  ;
  LVar5 = ListReader::size((ListReader *)local_168);
  if (LVar5 == 4) {
    for (element._44_4_ = 0; (int)element._44_4_ < 4; element._44_4_ = element._44_4_ + 1) {
      ListReader::getStructElement((StructReader *)local_1d0,(ListReader *)local_168,element._44_4_)
      ;
      iVar6 = element._44_4_ + 300;
      iVar7 = StructReader::getDataField<int>((StructReader *)local_1d0,0);
      if (iVar6 != iVar7) {
        local_1d1 = kj::_::Debug::shouldLog(ERROR);
        while (local_1d1 != false) {
          local_1d8 = element._44_4_ + 300;
          local_1dc = StructReader::getDataField<int>((StructReader *)local_1d0,0);
          kj::_::Debug::log<char_const(&)[76],int,int>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x10b,ERROR,
                     "\"failed: expected \" \"(300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))\", 300 + i, element.getDataField<int32_t>(0 * ELEMENTS)"
                     ,(char (*) [76])
                      "failed: expected (300 + i) == (element.getDataField<int32_t>(0 * ELEMENTS))",
                     &local_1d8,&local_1dc);
          local_1d1 = false;
        }
      }
      iVar6 = element._44_4_ + 400;
      StructReader::getPointerField((PointerReader *)local_230,(StructReader *)local_1d0,0);
      PointerReader::getStruct
                (&local_210,(PointerReader *)local_230,
                 (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
      iVar7 = StructReader::getDataField<int>(&local_210,0);
      if (iVar6 != iVar7) {
        local_231 = kj::_::Debug::shouldLog(ERROR);
        while (local_231 != false) {
          local_238 = element._44_4_ + 400;
          StructReader::getPointerField
                    ((PointerReader *)&list_2.nestingLimit,(StructReader *)local_1d0,0);
          PointerReader::getStruct
                    (&local_270,(PointerReader *)&list_2.nestingLimit,
                     (word *)(anonymous_namespace)::STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT);
          local_23c = StructReader::getDataField<int>(&local_270,0);
          kj::_::Debug::log<char_const(&)[162],int,int>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                     ,0x10f,ERROR,
                     "\"failed: expected \" \"(400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))\", 400 + i, element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS)"
                     ,(char (*) [162])
                      "failed: expected (400 + i) == (element.getPointerField(0 * POINTERS) .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words) .getDataField<int32_t>(0 * ELEMENTS))"
                     ,&local_238,&local_23c);
          local_231 = false;
        }
      }
    }
    StructReader::getPointerField((PointerReader *)&f_2,(StructReader *)&stack0x00000008,3);
    PointerReader::getList((ListReader *)local_2c0,(PointerReader *)&f_2,POINTER,(word *)0x0);
    LVar5 = ListReader::size((ListReader *)local_2c0);
    if (LVar5 != 5) {
      i_1 = 5;
      local_2f0 = ListReader::size((ListReader *)local_2c0);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
                (&local_2e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x115,FAILED,"(5 * ELEMENTS) == (list.size())","5 * ELEMENTS, list.size()",&i_1,
                 &local_2f0);
      kj::_::Debug::Fault::fatal(&local_2e8);
    }
    element_1._44_4_ = 0;
    while( true ) {
      if (4 < (uint)element_1._44_4_) {
        return;
      }
      ListReader::getPointerElement((PointerReader *)&f_3,(ListReader *)local_2c0,element_1._44_4_);
      PointerReader::getList((ListReader *)local_328,(PointerReader *)&f_3,TWO_BYTES,(word *)0x0);
      LVar5 = element_1._44_4_ + 1;
      LVar8 = ListReader::size((ListReader *)local_328);
      if (LVar5 != LVar8) break;
      for (local_35c = 0; local_35c <= (uint)element_1._44_4_; local_35c = local_35c + 1) {
        uVar4 = local_35c + 500;
        uVar3 = ListReader::getDataElement<unsigned_short>((ListReader *)local_328,local_35c);
        if (uVar4 != uVar3) {
          local_35d = kj::_::Debug::shouldLog(ERROR);
          while (local_35d != false) {
            local_364 = local_35c + 500;
            local_366 = ListReader::getDataElement<unsigned_short>
                                  ((ListReader *)local_328,local_35c);
            kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_short>
                      ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                       ,0x11b,ERROR,
                       "\"failed: expected \" \"(500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))\", 500u + j, element.getDataElement<uint16_t>(j * ELEMENTS)"
                       ,(char (*) [80])
                        "failed: expected (500u + j) == (element.getDataElement<uint16_t>(j * ELEMENTS))"
                       ,&local_364,&local_366);
            local_35d = false;
          }
        }
      }
      element_1._44_4_ = element_1._44_4_ + 1;
    }
    j = element_1._44_4_ + 1;
    LStack_358 = ListReader::size((ListReader *)local_328);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_350,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x119,FAILED,"((i + 1) * ELEMENTS) == (element.size())",
               "(i + 1) * ELEMENTS, element.size()",&j,&stack0xfffffffffffffca8);
    kj::_::Debug::Fault::fatal(&local_350);
  }
  i = 4;
  local_198 = ListReader::size((ListReader *)local_168);
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&local_190,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x108,FAILED,"(4 * ELEMENTS) == (list.size())","4 * ELEMENTS, list.size()",(uint *)&i,
             &local_198);
  kj::_::Debug::Fault::fatal(&local_190);
}

Assistant:

static void checkStruct(StructReader reader) {
  EXPECT_EQ(0x1011121314151617ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0x20212223u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x3031u, reader.getDataField<uint16_t>(6 * ELEMENTS));
  EXPECT_EQ(0x40u, reader.getDataField<uint8_t>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(120 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(121 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(122 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(123 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(124 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(125 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(126 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(127 * ELEMENTS));

  {
    StructReader subStruct = reader.getPointerField(0 * POINTERS)
                                   .getStruct(SUBSTRUCT_DEFAULT.words);
    EXPECT_EQ(123u, subStruct.getDataField<uint32_t>(0 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(1 * POINTERS).getList(ElementSize::FOUR_BYTES, nullptr);
    ASSERT_EQ(3 * ELEMENTS, list.size());
    EXPECT_EQ(200, list.getDataElement<int32_t>(0 * ELEMENTS));
    EXPECT_EQ(201, list.getDataElement<int32_t>(1 * ELEMENTS));
    EXPECT_EQ(202, list.getDataElement<int32_t>(2 * ELEMENTS));
  }

  {
    ListReader list = reader.getPointerField(2 * POINTERS)
                            .getList(ElementSize::INLINE_COMPOSITE, nullptr);
    ASSERT_EQ(4 * ELEMENTS, list.size());
    for (int i = 0; i < 4; i++) {
      StructReader element = list.getStructElement(i * ELEMENTS);
      EXPECT_EQ(300 + i, element.getDataField<int32_t>(0 * ELEMENTS));
      EXPECT_EQ(400 + i,
          element.getPointerField(0 * POINTERS)
                 .getStruct(STRUCTLIST_ELEMENT_SUBSTRUCT_DEFAULT.words)
                 .getDataField<int32_t>(0 * ELEMENTS));
    }
  }

  {
    ListReader list = reader.getPointerField(3 * POINTERS).getList(ElementSize::POINTER, nullptr);
    ASSERT_EQ(5 * ELEMENTS, list.size());
    for (uint i = 0; i < 5; i++) {
      ListReader element = list.getPointerElement(i * ELEMENTS)
                               .getList(ElementSize::TWO_BYTES, nullptr);
      ASSERT_EQ((i + 1) * ELEMENTS, element.size());
      for (uint j = 0; j <= i; j++) {
        EXPECT_EQ(500u + j, element.getDataElement<uint16_t>(j * ELEMENTS));
      }
    }
  }
}